

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O3

void __thiscall mathCore::recursive_idempotent(mathCore *this,expression *a)

{
  expression *a_00;
  iterator iVar1;
  iterator __position;
  expression *a_01;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar2;
  expression *child;
  expSet tempSet;
  key_type local_78;
  expression *local_70;
  _Alloc_node local_68;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  idempotent_law(this,a);
  universal_bound((expression *)this);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = (expression *)this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (*(_Base_ptr *)(this + 0x20) != (_Base_ptr)(this + 0x10)) {
    __position._M_node = *(_Base_ptr *)(this + 0x20);
    do {
      local_78 = *(key_type *)(__position._M_node + 1);
      iVar1 = std::
              _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                  *)(this + 8),__position._M_node);
      recursive_idempotent((mathCore *)local_78,(expression *)__position._M_node);
      pVar2 = std::
              _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
              ::_M_get_insert_equal_pos(&local_60,&local_78);
      local_68._M_t = &local_60;
      std::
      _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
      ::
      _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  *)&local_60,pVar2.first,pVar2.second,&local_78,&local_68);
      __position = iVar1;
    } while (iVar1._M_node != (_Base_ptr)(this + 0x10));
  }
  a_01 = (expression *)&local_60;
  mergeMultiSet((expSet *)(this + 8),(expSet *)a_01);
  a_00 = local_70;
  idempotent_law((mathCore *)local_70,a_01);
  universal_bound(a_00);
  std::
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void mathCore::recursive_idempotent(expression* a) {
	mathCore::idempotent_law(a);
	mathCore::universal_bound(a);

	// We simplify first, because it might help stop recursion

	expSet tempSet;
	expression* child;
	auto iter = a->contents.begin();

	
	while (iter != a->contents.end()) {
		child = *iter;
		iter = a->contents.erase(iter);

		recursive_idempotent(child);
		tempSet.insert(child);
	}

	mergeMultiSet(a->contents, tempSet);

	mathCore::idempotent_law(a);
	mathCore::universal_bound(a);

	// We simplify After, because one of our children might have changed!
}